

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_gif * rf_load_animated_gif
                   (rf_gif *__return_storage_ptr__,void *data,rf_int data_size,
                   rf_allocator allocator,rf_allocator temp_allocator)

{
  rf_source_location rVar1;
  rf_source_location rVar2;
  rf_allocator_args rVar3;
  undefined1 auVar4 [24];
  int iVar5;
  stbi__context *__src;
  int *piVar6;
  void *__dest;
  size_t __n;
  long lVar7;
  rf_allocator_proc *two_back;
  ulong size;
  uint old_size;
  int iVar8;
  undefined8 *puVar9;
  long *in_FS_OFFSET;
  int local_8b54;
  void *local_8b50;
  int component_count;
  rf_gif *local_8b40;
  uint local_8b38;
  int local_8b34;
  undefined8 *local_8b30;
  long local_8b28;
  long local_8b20;
  long local_8b18;
  void *local_8b10;
  undefined8 uStack_8b08;
  undefined4 local_8b00;
  uint uStack_8afc;
  char *local_8af8;
  char *pcStack_8af0;
  undefined8 local_8ae8;
  undefined8 local_8ae0;
  size_t sStack_8ad8;
  undefined4 local_8ad0;
  uint uStack_8acc;
  char *local_8ac8;
  char *pcStack_8ac0;
  undefined8 local_8ab8;
  stbi_uc *local_8ab0;
  undefined8 uStack_8aa8;
  undefined4 local_8aa0;
  char *local_8a98;
  char *pcStack_8a90;
  undefined8 local_8a88;
  stbi_uc *local_8a80;
  undefined8 uStack_8a78;
  undefined4 local_8a70;
  char *local_8a68;
  char *pcStack_8a60;
  undefined8 local_8a58;
  stbi_uc *local_8a50;
  undefined8 uStack_8a48;
  undefined4 local_8a40;
  char *local_8a38;
  char *pcStack_8a30;
  undefined8 local_8a28;
  stbi_uc *local_8a20;
  undefined8 uStack_8a18;
  undefined4 local_8a10;
  char *local_8a08;
  char *pcStack_8a00;
  undefined8 local_89f8;
  stbi_uc *local_89f0;
  undefined8 uStack_89e8;
  undefined4 local_89e0;
  char *local_89d8;
  char *pcStack_89d0;
  undefined8 local_89c8;
  stbi_uc *local_89c0;
  undefined8 uStack_89b8;
  undefined4 local_89b0;
  char *local_89a8;
  char *pcStack_89a0;
  undefined8 local_8998;
  rf_allocator allocator_local;
  stbi__context local_8980;
  stbi__gif g;
  
  two_back = allocator.allocator_proc;
  allocator_local.user_data = allocator.user_data;
  (__return_storage_ptr__->field_2).image.data = (void *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->frame_delays = (int *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 0x10) = 0;
  component_count = 0;
  local_8980.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_8980.read_from_callbacks = 0;
  puVar9 = (undefined8 *)(*in_FS_OFFSET + -0x430);
  local_8980.callback_already_read = 0;
  in_FS_OFFSET[-0x86] = (long)temp_allocator.user_data;
  in_FS_OFFSET[-0x85] = (long)temp_allocator.allocator_proc;
  local_8980.img_buffer_end = (stbi_uc *)((long)(int)data_size + (long)data);
  allocator_local.allocator_proc = two_back;
  local_8980.img_buffer = (stbi_uc *)data;
  local_8980.img_buffer_original = (stbi_uc *)data;
  local_8980.img_buffer_original_end = local_8980.img_buffer_end;
  iVar5 = stbi__gif_test(&local_8980);
  if (iVar5 == 0) {
    in_FS_OFFSET[-0x81] = (long)"not GIF";
    local_8b50 = (void *)0x0;
  }
  else {
    local_8b30 = puVar9;
    memset(&g,0,0x8870);
    __return_storage_ptr__->frame_delays = (int *)0x0;
    size = 4;
    local_8b50 = (void *)0x0;
    local_8b18 = 0;
    local_8b54 = 0;
    lVar7 = 0;
    old_size = 0;
    local_8b40 = __return_storage_ptr__;
    while( true ) {
      __return_storage_ptr__ = local_8b40;
      __src = (stbi__context *)
              stbi__gif_load_next(&local_8980,&g,&component_count,(int)local_8b18,
                                  (stbi_uc *)two_back);
      puVar9 = local_8b30;
      if ((__src == &local_8980) || (__src == (stbi__context *)0x0)) break;
      (__return_storage_ptr__->field_2).image.width = g.w;
      (__return_storage_ptr__->field_2).image.height = g.h;
      local_8b28 = lVar7 + 1;
      iVar8 = g.h * g.w;
      local_8b34 = iVar8 * 4;
      iVar5 = (int)local_8b28;
      local_8b38 = local_8b34 * iVar5;
      two_back = (rf_allocator_proc *)(ulong)local_8b38;
      local_8b20 = lVar7;
      if (local_8b50 == (void *)0x0) {
        local_8b50 = stbi__malloc((long)(int)local_8b38);
        piVar6 = (int *)stbi__malloc(size);
        __return_storage_ptr__->frame_delays = piVar6;
        local_8b54 = (int)size;
      }
      else {
        local_8b50 = rf_realloc_wrapper(*(rf_allocator *)(in_FS_OFFSET + -0x86),local_8b50,old_size,
                                        local_8b38);
        puVar9 = local_8b30;
        if (local_8b50 == (void *)0x0) {
          local_89a8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_89a0 = "stbi__load_gif_main";
          local_89c0 = g.out;
          uStack_89b8 = 0;
          local_8998 = 0x29f7;
          local_89b0 = 0;
          (*(code *)in_FS_OFFSET[-0x85])(local_8b30,3);
          local_89d8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_89d0 = "stbi__load_gif_main";
          local_89f0 = g.history;
          uStack_89e8 = 0;
          local_89c8 = 0x29f8;
          local_89e0 = 0;
          (*(code *)in_FS_OFFSET[-0x85])(puVar9,3);
          local_8a08 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_8a00 = "stbi__load_gif_main";
          local_8a20 = g.background;
          uStack_8a18 = 0;
          local_89f8 = 0x29f9;
          local_8a10 = 0;
          (*(code *)in_FS_OFFSET[-0x85])(puVar9,3);
          in_FS_OFFSET[-0x81] = (long)"outofmem";
          local_8b50 = (void *)0x0;
          __return_storage_ptr__ = local_8b40;
          goto LAB_0012e928;
        }
        two_back = (rf_allocator_proc *)(size & 0xffffffff);
        piVar6 = (int *)rf_realloc_wrapper(*(rf_allocator *)(in_FS_OFFSET + -0x86),
                                           local_8b40->frame_delays,local_8b54,(int)size);
        local_8b40->frame_delays = piVar6;
        local_8b54 = iVar5 * 4;
      }
      lVar7 = local_8b20;
      memcpy((void *)((long)((int)local_8b20 * local_8b34) + (long)local_8b50),__src,
             (long)local_8b34);
      if (lVar7 != 0) {
        local_8b18 = (long)local_8b50 - (long)(iVar8 * 8);
      }
      piVar6[lVar7] = g.delay;
      size = size + 4;
      lVar7 = local_8b28;
      old_size = local_8b38;
    }
    local_8a38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_8a30 = "stbi__load_gif_main";
    local_8a50 = g.out;
    uStack_8a48 = 0;
    local_8a28 = 0x2a19;
    local_8a40 = 0;
    (*(code *)in_FS_OFFSET[-0x85])(local_8b30,3);
    local_8a68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_8a60 = "stbi__load_gif_main";
    local_8a80 = g.history;
    uStack_8a78 = 0;
    local_8a58 = 0x2a1a;
    local_8a70 = 0;
    (*(code *)in_FS_OFFSET[-0x85])(puVar9,3);
    local_8a98 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_8a90 = "stbi__load_gif_main";
    local_8ab0 = g.background;
    uStack_8aa8 = 0;
    local_8a88 = 0x2a1b;
    local_8aa0 = 0;
    (*(code *)in_FS_OFFSET[-0x85])(puVar9,3);
    __return_storage_ptr__->frames_count = (int)lVar7;
LAB_0012e928:
    if ((local_8b50 != (void *)0x0) && (component_count == 4)) {
      local_8ac8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_8ac0 = "rf_load_animated_gif";
      local_8ab8 = 0x4695;
      local_8ae0 = 0;
      __n = (size_t)((__return_storage_ptr__->field_2).image.width *
                     (__return_storage_ptr__->field_2).image.height * 4);
      local_8ad0 = 0;
      rVar1.proc_name._0_4_ = 0x173545;
      rVar1.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar1.proc_name._4_4_ = 0;
      rVar1.line_in_file = 0x4695;
      auVar4._8_8_ = (ulong)uStack_8acc << 0x20;
      auVar4._0_8_ = __n;
      auVar4._16_8_ = 0;
      sStack_8ad8 = __n;
      __dest = (*allocator_local.allocator_proc)
                         (&allocator_local,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar4 << 0x40));
      if (__dest != (void *)0x0) {
        memcpy(__dest,local_8b50,__n);
        (__return_storage_ptr__->field_2).image.data = __dest;
        (__return_storage_ptr__->field_2).image.format = RF_UNCOMPRESSED_R8G8B8A8;
        (__return_storage_ptr__->field_2).image.valid = true;
      }
    }
  }
  local_8af8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_8af0 = "rf_load_animated_gif";
  uStack_8b08 = 0;
  local_8ae8 = 0x46a1;
  local_8b00 = 0;
  rVar2.proc_name._0_4_ = 0x173545;
  rVar2.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar2.proc_name._4_4_ = 0;
  rVar2.line_in_file = 0x46a1;
  rVar3.size_to_allocate_or_reallocate = 0;
  rVar3.pointer_to_free_or_realloc = local_8b50;
  rVar3._16_8_ = (ulong)uStack_8afc << 0x20;
  local_8b10 = local_8b50;
  (*temp_allocator.allocator_proc)(&temp_allocator,rVar2,RF_AM_FREE,rVar3);
  *puVar9 = 0;
  puVar9[1] = 0;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_gif rf_load_animated_gif(const void* data, rf_int data_size, rf_allocator allocator, rf_allocator temp_allocator)
{
    rf_gif gif = {0};

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
    {
        int component_count = 0;
        void* loaded_gif = stbi_load_gif_from_memory(data, data_size, &gif.frame_delays, &gif.width, &gif.height, &gif.frames_count, &component_count, 4);

        if (loaded_gif && component_count == 4)
        {
            int loaded_gif_size = gif.width * gif.height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
            void* dst = RF_ALLOC(allocator, loaded_gif_size);

            if (dst)
            {
                memcpy(dst, loaded_gif, loaded_gif_size);

                gif.data   = dst;
                gif.format = RF_UNCOMPRESSED_R8G8B8A8;
                gif.valid  = true;
            }
        }

        RF_FREE(temp_allocator, loaded_gif);
    }
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

    return gif;
}